

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer source;
  string local_50;
  
  pcVar1 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar1 == (char *)0x0) {
    pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
      for (source = (pvVar2->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg),
          source != (pvVar2->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        cmOutputConverter::Convert
                  (&local_50,&this->super_cmOutputConverter,source,START_OUTPUT,UNCHANGED);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      return __return_storage_ptr__;
    }
  }
  else {
    default_comment = cmCustomCommandGenerator::GetComment(ccg);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,default_comment,(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ConstructComment(cmCustomCommandGenerator const& ccg,
                                   const char* default_comment)
{
  // Check for a comment provided with the command.
  if(ccg.GetComment())
    {
    return ccg.GetComment();
    }

  // Construct a reasonable default comment if possible.
  if(!ccg.GetOutputs().empty())
    {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    for(std::vector<std::string>::const_iterator o = ccg.GetOutputs().begin();
        o != ccg.GetOutputs().end(); ++o)
      {
      comment += sep;
      comment += this->Convert(*o, cmLocalGenerator::START_OUTPUT);
      sep = ", ";
      }
    return comment;
    }

  // Otherwise use the provided default.
  return default_comment;
}